

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::isInt(Value *this)

{
  char cVar1;
  bool local_2a;
  bool local_29;
  Value *this_local;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x01') {
    local_29 = false;
    if (-0x80000001 < (this->value_).int_) {
      local_29 = (this->value_).int_ < 0x80000000;
    }
    this_local._7_1_ = local_29;
  }
  else if (cVar1 == '\x02') {
    this_local._7_1_ = (this->value_).uint_ < 0x80000000;
  }
  else if (cVar1 == '\x03') {
    local_2a = false;
    if ((-2147483648.0 <= (this->value_).real_) &&
       (local_2a = false, (this->value_).real_ <= 2147483647.0)) {
      local_2a = IsIntegral((this->value_).real_);
    }
    this_local._7_1_ = local_2a;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::isInt() const {
  switch (type_) {
  case intValue:
    return value_.int_ >= minInt && value_.int_ <= maxInt;
  case uintValue:
    return value_.uint_ <= UInt(maxInt);
  case realValue:
    return value_.real_ >= minInt && value_.real_ <= maxInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}